

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.c
# Opt level: O0

_Bool TransformerUpdateTransformationMatrix(Transformer *transformer)

{
  unkbyte10 Var1;
  longdouble lVar2;
  Matrix *a;
  Matrix *b;
  Matrix *b_00;
  Matrix *b_01;
  Matrix *b_02;
  Matrix *a_00;
  Matrix *a_01;
  Matrix *a_02;
  Matrix *pMVar3;
  void *pvVar4;
  longdouble lVar5;
  longdouble in_ST1;
  longdouble in_ST4;
  Matrix *_d;
  Matrix *_c;
  Matrix *_b;
  Matrix *_a;
  Matrix *rotateZ;
  Real _rotateZ [4] [4];
  Matrix *rotateY;
  Real _rotateY [4] [4];
  Matrix *rotateX;
  Real _rotateX [4] [4];
  Matrix *scale;
  Real _scale [4] [4];
  Matrix *translate;
  Real _translate [4] [4];
  Transformer *transformer_local;
  
  _translate = (longdouble)1;
  lVar2 = (longdouble)0;
  _translate[0]._40_10_ = *(unkbyte10 *)&(transformer->location).x;
  _translate[1]._40_10_ = *(unkbyte10 *)&(transformer->location).y;
  _translate[2]._40_10_ = *(unkbyte10 *)&(transformer->location).z;
  _translate[3][2]._8_8_ = 0x8000000000000000;
  _translate[3][3]._0_8_ = 0x3fff;
  _translate[3][1]._8_8_ = 0;
  _translate[3][2]._0_8_ = 0;
  _translate[3][0]._8_8_ = 0;
  _translate[3][1]._0_8_ = 0;
  _translate[2][3]._8_8_ = 0;
  _translate[3][0]._0_8_ = 0;
  _translate[0]._8_10_ = lVar2;
  _translate[0]._24_10_ = lVar2;
  _translate._56_10_ = lVar2;
  _translate[1]._8_10_ = _translate;
  _translate[1]._24_10_ = lVar2;
  _translate._120_10_ = lVar2;
  _translate[2]._8_10_ = lVar2;
  _translate[2]._24_10_ = _translate;
  a = MatrixFromArray(4,4,(Real_0_ *)&translate);
  _scale[2][2]._8_8_ = 0;
  _scale[2][3]._0_8_ = 0;
  _scale[2][2]._2_6_ = 0;
  _scale[2][0]._8_8_ = 0;
  _scale[2][1]._0_8_ = 0;
  _scale[1][3]._8_8_ = 0;
  _scale[2][0]._0_8_ = 0;
  _scale[1][2]._8_8_ = 0;
  _scale[1][3]._0_8_ = 0;
  _scale[1][1]._8_8_ = 0;
  _scale[1][2]._0_8_ = 0;
  _scale[1][1]._2_6_ = 0;
  _scale[0][3]._8_8_ = 0;
  _scale[1][0]._0_8_ = 0;
  _scale[0][2]._8_8_ = 0;
  _scale[0][3]._0_8_ = 0;
  _scale[0][1]._8_8_ = 0;
  _scale[0][2]._0_8_ = 0;
  _scale[0][0]._8_8_ = 0;
  _scale[0][1]._0_8_ = 0;
  _scale[0][0]._2_6_ = 0;
  Var1 = *(unkbyte10 *)&(transformer->scale).x;
  scale = (Matrix *)Var1;
  _scale[0][0]._0_2_ = (undefined2)((unkuint10)Var1 >> 0x40);
  Var1 = *(unkbyte10 *)&(transformer->scale).y;
  _scale[1][0]._8_8_ = (undefined8)Var1;
  _scale[1][1]._0_2_ = (undefined2)((unkuint10)Var1 >> 0x40);
  Var1 = *(unkbyte10 *)&(transformer->scale).z;
  _scale[2][1]._8_8_ = (undefined8)Var1;
  _scale[2][2]._0_2_ = (undefined2)((unkuint10)Var1 >> 0x40);
  _scale[3][2]._8_8_ = 0x8000000000000000;
  _scale[3][3]._0_8_ = 0x3fff;
  _scale[3][1]._8_8_ = 0;
  _scale[3][2]._0_8_ = 0;
  _scale[3][0]._8_8_ = 0;
  _scale[3][1]._0_8_ = 0;
  _scale[2][3]._8_8_ = 0;
  _scale[3][0]._0_8_ = 0;
  b = MatrixFromArray(4,4,(Real_0_ *)&scale);
  _rotateX[0][2]._8_8_ = 0;
  _rotateX[0][3]._0_8_ = 0;
  _rotateX[0][1]._8_8_ = 0;
  _rotateX[0][2]._0_8_ = 0;
  _rotateX[0][0]._8_8_ = 0;
  _rotateX[0][1]._0_8_ = 0;
  rotateX = (Matrix *)0x8000000000000000;
  _rotateX[0][0]._0_8_ = 0x3fff;
  lVar5 = in_ST4;
  _rotateX._56_10_ = lVar2;
  cosl();
  sinl();
  _rotateX[1]._24_10_ = -in_ST1;
  _rotateX[1]._40_10_ = lVar2;
  _rotateX._120_10_ = lVar2;
  sinl();
  cosl();
  _rotateX[3][2]._8_8_ = 0x8000000000000000;
  _rotateX[3][3]._0_8_ = 0x3fff;
  _rotateX[3][1]._8_8_ = 0;
  _rotateX[3][2]._0_8_ = 0;
  _rotateX[3][0]._8_8_ = 0;
  _rotateX[3][1]._0_8_ = 0;
  _rotateX[2][3]._8_8_ = 0;
  _rotateX[3][0]._0_8_ = 0;
  _rotateX[2]._40_10_ = lVar2;
  b_00 = MatrixFromArray(4,4,(Real_0_ *)&rotateX);
  cosl();
  _rotateY[0]._8_10_ = lVar2;
  sinl();
  _rotateY[1][2]._8_8_ = 0;
  _rotateY[1][3]._0_8_ = 0;
  _rotateY[1][1]._8_8_ = 0;
  _rotateY[1][2]._0_8_ = 0;
  _rotateY[1][0]._8_8_ = 0x8000000000000000;
  _rotateY[1][1]._0_8_ = 0x3fff;
  _rotateY[0][3]._8_8_ = 0;
  _rotateY[1][0]._0_8_ = 0;
  _rotateY[0]._40_10_ = lVar2;
  sinl();
  _rotateY._120_10_ = -in_ST4;
  _rotateY[2]._8_10_ = lVar2;
  cosl();
  _rotateY[3][2]._8_8_ = 0x8000000000000000;
  _rotateY[3][3]._0_8_ = 0x3fff;
  _rotateY[3][1]._8_8_ = 0;
  _rotateY[3][2]._0_8_ = 0;
  _rotateY[3][0]._8_8_ = 0;
  _rotateY[3][1]._0_8_ = 0;
  _rotateY[2][3]._8_8_ = 0;
  _rotateY[3][0]._0_8_ = 0;
  _rotateY[2]._40_10_ = lVar2;
  b_01 = MatrixFromArray(4,4,(Real_0_ *)&rotateY);
  cosl();
  sinl();
  _rotateZ[0]._8_10_ = -lVar5;
  _rotateZ[0]._24_10_ = lVar2;
  _rotateZ[0]._40_10_ = lVar2;
  sinl();
  cosl();
  pvVar4 = (void *)((long)_rotateZ[1] + 0x38);
  _rotateZ[1]._24_10_ = lVar2;
  _rotateZ[1]._40_10_ = lVar2;
  memset(pvVar4,0,0x40);
  memcpy(pvVar4,&DAT_00114710,0x40);
  pvVar4 = (void *)((long)_rotateZ[2] + 0x38);
  memset(pvVar4,0,0x40);
  memcpy(pvVar4,&DAT_00114750,0x40);
  b_02 = MatrixFromArray(4,4,(Real_0_ *)&rotateZ);
  a_00 = MatrixMultiplication(a,b);
  a_01 = MatrixMultiplication(a_00,b_00);
  a_02 = MatrixMultiplication(a_01,b_01);
  pMVar3 = MatrixMultiplication(a_02,b_02);
  if (transformer->matrix != (Matrix *)0x0) {
    MatrixDestroy(transformer->matrix);
  }
  transformer->matrix = pMVar3;
  if (transformer->inverseMatrix != (Matrix *)0x0) {
    MatrixDestroy(transformer->inverseMatrix);
  }
  pMVar3 = MatrixInverse(pMVar3);
  transformer->inverseMatrix = pMVar3;
  MatrixDestroy(a_02);
  MatrixDestroy(a_01);
  MatrixDestroy(a_00);
  MatrixDestroy(b_02);
  MatrixDestroy(b_01);
  MatrixDestroy(b_00);
  MatrixDestroy(b);
  MatrixDestroy(a);
  return true;
}

Assistant:

bool TransformerUpdateTransformationMatrix(Transformer *transformer) {
  // translate
  Real _translate[][4] = {{1, 0, 0, transformer->location.x}, {0, 1, 0, transformer->location.y}, {0, 0, 1, transformer->location.z}, {0, 0, 0, 1}};
  Matrix *translate = MatrixFromArray(4, 4, _translate);

  // scale
  Real _scale[][4] = {{transformer->scale.x, 0, 0, 0}, {0, transformer->scale.y, 0, 0}, {0, 0, transformer->scale.z, 0}, {0, 0, 0, 1}};
  Matrix *scale = MatrixFromArray(4, 4, _scale);

  // rotate X axis
  Real _rotateX[][4] = {
      {1, 0, 0, 0}, {0, cosl((transformer->rotation.x)), -sinl((transformer->rotation.x)), 0}, {0, sinl((transformer->rotation.x)), cosl((transformer->rotation.x)), 0}, {0, 0, 0, 1}};
  Matrix *rotateX = MatrixFromArray(4, 4, _rotateX);

  // rotate Y axis
  Real _rotateY[][4] = {{cosl(transformer->rotation.y), 0, sinl(transformer->rotation.y), 0}, {0, 1, 0, 0}, {-sinl(transformer->rotation.y), 0, cosl(transformer->rotation.y), 0}, {0, 0, 0, 1}};
  Matrix *rotateY = MatrixFromArray(4, 4, _rotateY);

  // rotate Z axis
  Real _rotateZ[][4] = {{cosl(transformer->rotation.z), -sinl(transformer->rotation.z), 0, 0}, {sinl(transformer->rotation.z), cosl(transformer->rotation.z), 0, 0}, {0, 0, 1, 0}, {0, 0, 0, 1}};
  Matrix *rotateZ = MatrixFromArray(4, 4, _rotateZ);

  Matrix *_a = MatrixMultiplication(translate, scale);
  Matrix *_b = MatrixMultiplication(_a, rotateX);
  Matrix *_c = MatrixMultiplication(_b, rotateY);
  Matrix *_d = MatrixMultiplication(_c, rotateZ);

  if (transformer->matrix != NULL) {
    MatrixDestroy(transformer->matrix);
  }
  transformer->matrix = _d;

  if (transformer->inverseMatrix != NULL) {
    MatrixDestroy(transformer->inverseMatrix);
  }
  transformer->inverseMatrix = MatrixInverse(_d);

  MatrixDestroy(_c);
  MatrixDestroy(_b);
  MatrixDestroy(_a);

  MatrixDestroy(rotateZ);
  MatrixDestroy(rotateY);
  MatrixDestroy(rotateX);

  MatrixDestroy(scale);
  MatrixDestroy(translate);

  return true;
}